

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

StackSym * __thiscall
BackwardPass::ProcessByteCodeUsesDst(BackwardPass *this,ByteCodeUsesInstr *byteCodeUsesInstr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  BackwardPass *sym;
  char *this_01;
  BackwardPass *this_02;
  
  bVar2 = DoByteCodeUpwardExposedUsed(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x7cd,"(this->DoByteCodeUpwardExposedUsed())",
                       "this->DoByteCodeUpwardExposedUsed()");
    if (!bVar2) goto LAB_003de3b0;
    *puVar5 = 0;
  }
  this_00 = (byteCodeUsesInstr->super_Instr).m_dst;
  if (this_00 == (Opnd *)0x0) {
LAB_003de38b:
    sym = (BackwardPass *)0x0;
  }
  else {
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_003de3b0;
      *puVar5 = 0;
    }
    this_02 = (BackwardPass *)this_00[1]._vptr_Opnd;
    if (*(SymKind *)((long)&this_02->tempAlloc + 4) != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar2) goto LAB_003de3b0;
      *puVar5 = 0;
    }
    if ((this_00->field_0xb & 8) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x7d3,"(!dstRegOpnd->GetIsJITOptimizedReg())",
                         "!dstRegOpnd->GetIsJITOptimizedReg()");
      if (!bVar2) goto LAB_003de3b0;
      *puVar5 = 0;
    }
    this_01 = (char *)this_02;
    RVar4 = StackSym::GetByteCodeRegSlot((StackSym *)this_02);
    if (RVar4 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      this_01 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
      ;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x7d4,"(dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister)",
                         "dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister");
      if (!bVar2) {
LAB_003de3b0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    sym = this_02;
    if (this_02->field_0x1c != TyVar) {
      sym = (BackwardPass *)StackSym::GetVarEquivSym((StackSym *)this_02,(Func *)0x0);
      this_01 = (char *)this_02;
    }
    if (this->currentRegion != (Region *)0x0) {
      bVar2 = CheckWriteThroughSymInRegion
                        ((BackwardPass *)this_01,this->currentRegion,(StackSym *)sym);
      if (bVar2) goto LAB_003de38b;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear
              (this->currentBlock->byteCodeUpwardExposedUsed,*(BVIndex *)&sym->tempAlloc);
  }
  return (StackSym *)sym;
}

Assistant:

StackSym*
BackwardPass::ProcessByteCodeUsesDst(IR::ByteCodeUsesInstr * byteCodeUsesInstr)
{
    Assert(this->DoByteCodeUpwardExposedUsed());
    IR::Opnd * dst = byteCodeUsesInstr->GetDst();
    if (dst)
    {
        IR::RegOpnd * dstRegOpnd = dst->AsRegOpnd();
        StackSym * dstStackSym = dstRegOpnd->m_sym->AsStackSym();
        Assert(!dstRegOpnd->GetIsJITOptimizedReg());
        Assert(dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister);
        if (dstStackSym->GetType() != TyVar)
        {
            dstStackSym = dstStackSym->GetVarEquivSym(nullptr);
        }

        // If the current region is a Try, symbols in its write-through set shouldn't be cleared.
        // Otherwise, symbols in the write-through set of the first try ancestor shouldn't be cleared.
        if (!this->currentRegion ||
            !this->CheckWriteThroughSymInRegion(this->currentRegion, dstStackSym))
        {
            this->currentBlock->byteCodeUpwardExposedUsed->Clear(dstStackSym->m_id);
            return dstStackSym;

        }
    }
    return nullptr;
}